

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

mip_level * __thiscall crnlib::mip_level::operator=(mip_level *this,mip_level *rhs)

{
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar1;
  dxt_image *pdVar2;
  mip_level *rhs_local;
  mip_level *this_local;
  
  pdVar2 = (dxt_image *)rhs;
  clear(this);
  this->m_width = rhs->m_width;
  this->m_height = rhs->m_height;
  this->m_comp_flags = rhs->m_comp_flags;
  this->m_format = rhs->m_format;
  this->m_orient_flags = rhs->m_orient_flags;
  if (rhs->m_pImage != (image_u8 *)0x0) {
    piVar1 = crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>,crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                       ((crnlib *)rhs->m_pImage,
                        (image<crnlib::color_quad<unsigned_char,_int>_> *)pdVar2);
    this->m_pImage = piVar1;
  }
  if (rhs->m_pDXTImage != (dxt_image *)0x0) {
    pdVar2 = crnlib_new<crnlib::dxt_image,crnlib::dxt_image>((crnlib *)rhs->m_pDXTImage,pdVar2);
    this->m_pDXTImage = pdVar2;
  }
  return this;
}

Assistant:

mip_level& mip_level::operator=(const mip_level& rhs) {
  clear();

  m_width = rhs.m_width;
  m_height = rhs.m_height;
  m_comp_flags = rhs.m_comp_flags;
  m_format = rhs.m_format;
  m_orient_flags = rhs.m_orient_flags;

  if (rhs.m_pImage)
    m_pImage = crnlib_new<image_u8>(*rhs.m_pImage);

  if (rhs.m_pDXTImage)
    m_pDXTImage = crnlib_new<dxt_image>(*rhs.m_pDXTImage);

  return *this;
}